

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O3

void dirALIGN(void)

{
  uint len;
  bool preserveDeviceMemory;
  aint fill;
  aint val;
  int local_10;
  aint local_c;
  
  ParseAlignArguments(&lp,&local_c,&local_10);
  if (local_c == -1) {
    local_c = 4;
  }
  len = local_c - 1U & -CurAddress;
  if (0 < (int)len) {
    preserveDeviceMemory = local_10 == -1;
    if (preserveDeviceMemory) {
      local_10 = 0;
    }
    EmitBlock(local_10,len,preserveDeviceMemory,4);
  }
  return;
}

Assistant:

static void dirALIGN() {
	// default alignment is 4, default filler is "0/none" (if not specified in directive explicitly)
	aint val, fill;
	ParseAlignArguments(lp, val, fill);
	if (-1 == val) val = 4;
	// calculate how many bytes has to be filled to reach desired alignment
	aint len = (~CurAddress + 1) & (val - 1);
	if (len < 1) return;		// nothing to fill, already aligned
	if (-1 == fill) EmitBlock(0, len, true);
	else			EmitBlock(fill, len, false);
}